

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O3

int gzputc(gzFile file,int c)

{
  uint uVar1;
  int iVar2;
  z_size_t zVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  uchar buf [1];
  undefined1 local_19;
  
  uVar5 = 0xffffffff;
  if (((file != (gzFile)0x0) && (file[1].have == 0x79b1)) &&
     (*(int *)((long)&file[4].next + 4) == 0)) {
    if (*(int *)&file[4].next != 0) {
      *(undefined4 *)&file[4].next = 0;
      iVar2 = gz_zero((gz_statep)file,*(off64_t *)(file + 4));
      if (iVar2 == -1) {
        return -1;
      }
    }
    uVar5 = (uint)file[1].pos;
    if (uVar5 != 0) {
      uVar1 = *(uint *)&file[5].next;
      if ((ulong)uVar1 == 0) {
        lVar4 = *(long *)(file + 2);
        *(long *)(file + 5) = lVar4;
        lVar6 = lVar4;
      }
      else {
        lVar4 = *(long *)(file + 2);
        lVar6 = *(long *)(file + 5);
      }
      uVar7 = (lVar6 + (ulong)uVar1) - lVar4;
      if ((uint)uVar7 < uVar5) {
        *(char *)(lVar4 + (uVar7 & 0xffffffff)) = (char)c;
        *(int *)&file[5].next = *(int *)&file[5].next + 1;
        file->pos = file->pos + 1;
        return c & 0xff;
      }
    }
    local_19 = (char)c;
    zVar3 = gz_write((gz_statep)file,&local_19,1);
    uVar5 = 0xffffffff;
    if (zVar3 == 1) {
      uVar5 = c & 0xff;
    }
  }
  return uVar5;
}

Assistant:

int ZEXPORT gzputc(file, c)
    gzFile file;
    int c;
{
    unsigned have;
    unsigned char buf[1];
    gz_statep state;
    z_streamp strm;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK)
        return -1;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return -1;
    }

    /* try writing to input buffer for speed (state->size == 0 if buffer not
       initialized) */
    if (state->size) {
        if (strm->avail_in == 0)
            strm->next_in = state->in;
        have = (unsigned)((strm->next_in + strm->avail_in) - state->in);
        if (have < state->size) {
            state->in[have] = (unsigned char)c;
            strm->avail_in++;
            state->x.pos++;
            return c & 0xff;
        }
    }

    /* no room in buffer or not initialized, use gz_write() */
    buf[0] = (unsigned char)c;
    if (gz_write(state, buf, 1) != 1)
        return -1;
    return c & 0xff;
}